

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void dense2csr(CUPDLPcsr *csr,CUPDLPdense *dense)

{
  double dVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *pcVar3;
  cupdlp_int cVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  cVar4 = dense->nCols;
  csr->nRows = dense->nRows;
  csr->nCols = cVar4;
  pcVar2 = csr->rowMatBeg;
  *pcVar2 = 0;
  uVar7 = (ulong)(uint)csr->nRows;
  if (csr->nRows < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar9 = csr->nCols;
      if (0 < iVar9) {
        pcVar3 = dense->data;
        iVar8 = 0;
        do {
          dVar1 = pcVar3[(int)uVar7 * iVar8 + (int)lVar6];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            csr->rowMatIdx[iVar5] = iVar8;
            uVar7 = (ulong)(uint)csr->nRows;
            csr->rowMatElem[iVar5] = pcVar3[csr->nRows * iVar8 + (int)lVar6];
            iVar5 = iVar5 + 1;
            iVar9 = csr->nCols;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar9);
      }
      pcVar2[lVar6 + 1] = iVar5;
      lVar6 = lVar6 + 1;
      uVar7 = (ulong)csr->nRows;
    } while (lVar6 < (long)uVar7);
  }
  csr->nMatElem = iVar5;
  return;
}

Assistant:

void dense2csr(CUPDLPcsr *csr, CUPDLPdense *dense) {
  csr->nRows = dense->nRows;
  csr->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csr->rowMatBeg[0] = 0;
  for (iRow = 0; iRow < csr->nRows; ++iRow) {
    for (iCol = 0; iCol < csr->nCols; ++iCol) {
      if (dense->data[iCol * csr->nRows + iRow] != 0) {
        csr->rowMatIdx[nnz] = iCol;
        csr->rowMatElem[nnz] = dense->data[iCol * csr->nRows + iRow];
        ++nnz;
      }
    }
    csr->rowMatBeg[iRow + 1] = nnz;
  }
  csr->nMatElem = nnz;

  return;
}